

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O3

void __thiscall
vkt::tessellation::anon_unknown_1::IOBlock::IOBlock
          (IOBlock *this,string *blockName,string *interfaceName,
          vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
          *members)

{
  pointer pMVar1;
  pointer pMVar2;
  long lVar3;
  pointer pMVar4;
  pointer pcVar5;
  
  (this->super_TopLevelObject)._vptr_TopLevelObject = (_func_int **)&PTR__IOBlock_00d00980;
  (this->m_blockName)._M_dataplus._M_p = (pointer)&(this->m_blockName).field_2;
  pcVar5 = (blockName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_blockName,pcVar5,pcVar5 + blockName->_M_string_length);
  (this->m_interfaceName)._M_dataplus._M_p = (pointer)&(this->m_interfaceName).field_2;
  pcVar5 = (interfaceName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_interfaceName,pcVar5,pcVar5 + interfaceName->_M_string_length);
  lVar3 = (long)(members->
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(members->
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                )._M_impl.super__Vector_impl_data._M_start;
  (this->m_members).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_members).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_members).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar2 = std::
           _Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
           ::_M_allocate((_Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                          *)((lVar3 >> 3) * 0x6db6db6db6db6db7),(size_t)pcVar5);
  (this->m_members).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = pMVar2;
  (this->m_members).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar2;
  (this->m_members).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar3 + (long)pMVar2);
  pMVar1 = (members->
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar4 = (members->
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                )._M_impl.super__Vector_impl_data._M_start; pMVar4 != pMVar1; pMVar4 = pMVar4 + 1) {
    (pMVar2->name)._M_dataplus._M_p = (pointer)&(pMVar2->name).field_2;
    pcVar5 = (pMVar4->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pMVar2,pcVar5,pcVar5 + (pMVar4->name)._M_string_length);
    glu::VarType::VarType(&pMVar2->type,&pMVar4->type);
    pMVar2 = pMVar2 + 1;
  }
  (this->m_members).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar2;
  return;
}

Assistant:

IOBlock (const std::string& blockName, const std::string& interfaceName, const std::vector<Member>& members)
		: m_blockName		(blockName)
		, m_interfaceName	(interfaceName)
		, m_members			(members)
	{
	}